

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

int Dsd_TreeGetAigCost_rec(Dsd_Node_t *pNode)

{
  Dsd_Type_t DVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x103,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (-1 < pNode->nVisits) {
      uVar2 = (uint)pNode->nDecs;
      iVar4 = 0;
      if (1 < (int)uVar2) {
        DVar1 = pNode->Type;
        if (DVar1 == DSD_NODE_PRIME) {
          iVar4 = (uint)(pNode->nDecs == 3) * 3;
        }
        else if (DVar1 == DSD_NODE_EXOR) {
          iVar4 = uVar2 * 3 + -3;
        }
        else {
          iVar4 = 0;
          if (DVar1 == DSD_NODE_OR) {
            iVar4 = uVar2 - 1;
          }
        }
        for (lVar5 = 0; lVar5 < (short)uVar2; lVar5 = lVar5 + 1) {
          iVar3 = Dsd_TreeGetAigCost_rec
                            ((Dsd_Node_t *)((ulong)pNode->pDecs[lVar5] & 0xfffffffffffffffe));
          iVar4 = iVar4 + iVar3;
          uVar2 = (uint)(ushort)pNode->nDecs;
        }
      }
      return iVar4;
    }
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x105,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                ,0x104,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
}

Assistant:

int Dsd_TreeGetAigCost_rec( Dsd_Node_t * pNode )
{
    int i, Counter = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    if ( pNode->nDecs < 2 )
        return 0;

    // we don't want the two-input gates to count for non-decomposable blocks
    if ( pNode->Type == DSD_NODE_OR )
        Counter += pNode->nDecs - 1;
    else if ( pNode->Type == DSD_NODE_EXOR )
        Counter += 3*(pNode->nDecs - 1);
    else if ( pNode->Type == DSD_NODE_PRIME && pNode->nDecs == 3 )
        Counter += 3;

    // call recursively
    for ( i = 0; i < pNode->nDecs; i++ )
        Counter += Dsd_TreeGetAigCost_rec( Dsd_Regular(pNode->pDecs[i]) );
    return Counter;
}